

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O1

optional_idx
duckdb::CSVMultiFileInfo::MaxThreads
          (MultiFileBindData *bind_data,MultiFileGlobalState *global_state,
          FileExpandResult expand_result)

{
  idx_t in_RAX;
  pointer pTVar1;
  idx_t iVar2;
  CSVBufferManager *this;
  pointer this_00;
  idx_t iVar3;
  optional_idx local_18;
  
  local_18.index = in_RAX;
  pTVar1 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  if ((pTVar1[0x23].super_FunctionData._vptr_FunctionData == (_func_int **)0x0) ||
     (expand_result == MULTIPLE_FILES)) {
    local_18.index = 0xffffffffffffffff;
  }
  else {
    iVar2 = CSVIterator::BytesPerThread((CSVReaderOptions *)(pTVar1 + 1));
    this = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                     ((shared_ptr<duckdb::CSVBufferManager,_true> *)(pTVar1 + 0x23));
    this_00 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
              operator->(&this->file_handle);
    iVar3 = CSVFileHandle::FileSize(this_00);
    optional_idx::optional_idx(&local_18,iVar3 / iVar2 + 1);
  }
  return (optional_idx)local_18.index;
}

Assistant:

optional_idx CSVMultiFileInfo::MaxThreads(const MultiFileBindData &bind_data, const MultiFileGlobalState &global_state,
                                          FileExpandResult expand_result) {
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	if (!csv_data.buffer_manager) {
		return optional_idx();
	}
	if (expand_result == FileExpandResult::MULTIPLE_FILES) {
		// always launch max threads if we are reading multiple files
		return optional_idx();
	}
	const idx_t bytes_per_thread = CSVIterator::BytesPerThread(csv_data.options);
	const idx_t file_size = csv_data.buffer_manager->file_handle->FileSize();
	return file_size / bytes_per_thread + 1;
}